

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O2

uchar * stbi__convert_format(uchar *data,int img_n,int req_comp,uint x,uint y)

{
  uchar uVar1;
  byte bVar2;
  int iVar3;
  uchar *puVar4;
  int iVar5;
  ulong uVar6;
  long lVar7;
  int iVar8;
  byte *pbVar9;
  byte *pbVar10;
  ulong uVar11;
  ulong uVar12;
  ulong uVar13;
  long in_FS_OFFSET;
  
  if (req_comp != img_n) {
    uVar13 = 0;
    puVar4 = (uchar *)stbi__malloc_mad3(req_comp,x,y,0);
    if (puVar4 == (uchar *)0x0) {
      free(data);
      *(char **)(in_FS_OFFSET + -0x10) = "Out of memory";
      data = (uchar *)0x0;
    }
    else {
      uVar6 = (ulong)y;
      if ((int)y < 1) {
        uVar6 = uVar13;
      }
      iVar3 = req_comp + img_n * 8;
      iVar5 = x - 1;
      uVar11 = 0;
      for (uVar12 = 0; uVar12 != uVar6; uVar12 = uVar12 + 1) {
        if (iVar3 - 10U < 0x1a) {
          iVar8 = (int)uVar12 * x;
          pbVar10 = data + (uint)(iVar8 * img_n);
          pbVar9 = puVar4 + (uint)(iVar8 * req_comp);
          switch(iVar3) {
          case 10:
            lVar7 = 0;
            for (iVar8 = iVar5; -1 < iVar8; iVar8 = iVar8 + -1) {
              puVar4[lVar7 * 2 + uVar13] = data[lVar7 + uVar11];
              puVar4[lVar7 * 2 + uVar13 + 1] = 0xff;
              lVar7 = lVar7 + 1;
            }
            break;
          case 0xb:
            pbVar9 = puVar4 + uVar13 + 2;
            for (iVar8 = iVar5; -1 < iVar8; iVar8 = iVar8 + -1) {
              bVar2 = *pbVar10;
              *pbVar9 = bVar2;
              pbVar9[-1] = bVar2;
              pbVar9[-2] = bVar2;
              pbVar10 = pbVar10 + 1;
              pbVar9 = pbVar9 + 3;
            }
            break;
          case 0xc:
            lVar7 = 0;
            for (iVar8 = iVar5; -1 < iVar8; iVar8 = iVar8 + -1) {
              uVar1 = data[lVar7 + uVar11];
              puVar4[lVar7 * 4 + uVar13 + 2] = uVar1;
              puVar4[lVar7 * 4 + uVar13 + 1] = uVar1;
              puVar4[lVar7 * 4 + uVar13] = uVar1;
              puVar4[lVar7 * 4 + uVar13 + 3] = 0xff;
              lVar7 = lVar7 + 1;
            }
            break;
          case 0x11:
            lVar7 = 0;
            for (iVar8 = iVar5; -1 < iVar8; iVar8 = iVar8 + -1) {
              puVar4[lVar7 + uVar13] = data[lVar7 * 2 + uVar11];
              lVar7 = lVar7 + 1;
            }
            break;
          case 0x13:
            pbVar9 = puVar4 + uVar13 + 2;
            for (iVar8 = iVar5; -1 < iVar8; iVar8 = iVar8 + -1) {
              bVar2 = *pbVar10;
              *pbVar9 = bVar2;
              pbVar9[-1] = bVar2;
              pbVar9[-2] = bVar2;
              pbVar10 = pbVar10 + 2;
              pbVar9 = pbVar9 + 3;
            }
            break;
          case 0x14:
            lVar7 = 0;
            for (iVar8 = iVar5; -1 < iVar8; iVar8 = iVar8 + -1) {
              uVar1 = data[lVar7 + uVar11];
              puVar4[lVar7 * 2 + uVar13 + 2] = uVar1;
              puVar4[lVar7 * 2 + uVar13 + 1] = uVar1;
              puVar4[lVar7 * 2 + uVar13] = uVar1;
              puVar4[lVar7 * 2 + uVar13 + 3] = data[lVar7 + uVar11 + 1];
              lVar7 = lVar7 + 2;
            }
            break;
          case 0x19:
            for (iVar8 = iVar5; -1 < iVar8; iVar8 = iVar8 + -1) {
              *pbVar9 = (byte)((uint)pbVar10[2] * 0x1d +
                               (uint)pbVar10[1] * 0x96 + (uint)*pbVar10 * 0x4d >> 8);
              pbVar10 = pbVar10 + 3;
              pbVar9 = pbVar9 + 1;
            }
            break;
          case 0x1a:
            for (iVar8 = iVar5; -1 < iVar8; iVar8 = iVar8 + -1) {
              *pbVar9 = (byte)((uint)pbVar10[2] * 0x1d +
                               (uint)pbVar10[1] * 0x96 + (uint)*pbVar10 * 0x4d >> 8);
              pbVar9[1] = 0xff;
              pbVar10 = pbVar10 + 3;
              pbVar9 = pbVar9 + 2;
            }
            break;
          case 0x1c:
            for (iVar8 = iVar5; -1 < iVar8; iVar8 = iVar8 + -1) {
              *pbVar9 = *pbVar10;
              pbVar9[1] = pbVar10[1];
              pbVar9[2] = pbVar10[2];
              pbVar9[3] = 0xff;
              pbVar10 = pbVar10 + 3;
              pbVar9 = pbVar9 + 4;
            }
            break;
          case 0x21:
            lVar7 = 0;
            for (iVar8 = iVar5; -1 < iVar8; iVar8 = iVar8 + -1) {
              puVar4[lVar7 + uVar13] =
                   (uchar)((uint)data[lVar7 * 4 + uVar11 + 2] * 0x1d +
                           (uint)data[lVar7 * 4 + uVar11 + 1] * 0x96 +
                           (uint)data[lVar7 * 4 + uVar11] * 0x4d >> 8);
              lVar7 = lVar7 + 1;
            }
            break;
          case 0x22:
            lVar7 = 0;
            for (iVar8 = iVar5; -1 < iVar8; iVar8 = iVar8 + -1) {
              puVar4[lVar7 + uVar13] =
                   (uchar)((uint)data[lVar7 * 2 + uVar11 + 2] * 0x1d +
                           (uint)data[lVar7 * 2 + uVar11 + 1] * 0x96 +
                           (uint)data[lVar7 * 2 + uVar11] * 0x4d >> 8);
              puVar4[lVar7 + uVar13 + 1] = data[lVar7 * 2 + uVar11 + 3];
              lVar7 = lVar7 + 2;
            }
            break;
          case 0x23:
            for (iVar8 = iVar5; -1 < iVar8; iVar8 = iVar8 + -1) {
              *pbVar9 = *pbVar10;
              pbVar9[1] = pbVar10[1];
              pbVar9[2] = pbVar10[2];
              pbVar10 = pbVar10 + 4;
              pbVar9 = pbVar9 + 3;
            }
          }
        }
        uVar11 = (ulong)((int)uVar11 + x * img_n);
        uVar13 = (ulong)((int)uVar13 + x * req_comp);
      }
      free(data);
      data = puVar4;
    }
  }
  return data;
}

Assistant:

static unsigned char *stbi__convert_format(unsigned char *data, int img_n, int req_comp, unsigned int x, unsigned int y)
{
   int i,j;
   unsigned char *good;

   if (req_comp == img_n) return data;
   STBI_ASSERT(req_comp >= 1 && req_comp <= 4);

   good = (unsigned char *) stbi__malloc_mad3(req_comp, x, y, 0);
   if (good == NULL) {
      STBI_FREE(data);
      return stbi__errpuc("outofmem", "Out of memory");
   }

   for (j=0; j < (int) y; ++j) {
      unsigned char *src  = data + j * x * img_n   ;
      unsigned char *dest = good + j * x * req_comp;

      #define STBI__COMBO(a,b)  ((a)*8+(b))
      #define STBI__CASE(a,b)   case STBI__COMBO(a,b): for(i=x-1; i >= 0; --i, src += a, dest += b)
      // convert source image with img_n components to one with req_comp components;
      // avoid switch per pixel, so use switch per scanline and massive macros
      switch (STBI__COMBO(img_n, req_comp)) {
         STBI__CASE(1,2) { dest[0]=src[0]; dest[1]=255;                                     } break;
         STBI__CASE(1,3) { dest[0]=dest[1]=dest[2]=src[0];                                  } break;
         STBI__CASE(1,4) { dest[0]=dest[1]=dest[2]=src[0]; dest[3]=255;                     } break;
         STBI__CASE(2,1) { dest[0]=src[0];                                                  } break;
         STBI__CASE(2,3) { dest[0]=dest[1]=dest[2]=src[0];                                  } break;
         STBI__CASE(2,4) { dest[0]=dest[1]=dest[2]=src[0]; dest[3]=src[1];                  } break;
         STBI__CASE(3,4) { dest[0]=src[0];dest[1]=src[1];dest[2]=src[2];dest[3]=255;        } break;
         STBI__CASE(3,1) { dest[0]=stbi__compute_y(src[0],src[1],src[2]);                   } break;
         STBI__CASE(3,2) { dest[0]=stbi__compute_y(src[0],src[1],src[2]); dest[1] = 255;    } break;
         STBI__CASE(4,1) { dest[0]=stbi__compute_y(src[0],src[1],src[2]);                   } break;
         STBI__CASE(4,2) { dest[0]=stbi__compute_y(src[0],src[1],src[2]); dest[1] = src[3]; } break;
         STBI__CASE(4,3) { dest[0]=src[0];dest[1]=src[1];dest[2]=src[2];                    } break;
         default: STBI_ASSERT(0);
      }
      #undef STBI__CASE
   }

   STBI_FREE(data);
   return good;
}